

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v7::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,color_type text_color,char *esc)

{
  rgb local_37;
  int local_34;
  rgb color;
  long lStack_30;
  int i;
  size_t index;
  uint32_t value;
  bool is_background;
  char *esc_local;
  ansi_color_escape<char> *this_local;
  color_type text_color_local;
  
  if (((ulong)text_color & 1) == 0) {
    this_local._4_1_ = text_color.value._0_1_;
    index._0_4_ = (uint)this_local._4_1_;
    if (esc == "\x1b[48;2;") {
      index._0_4_ = (uint)index + 10;
    }
    this->buffer[0] = '\x1b';
    lStack_30 = 2;
    this->buffer[1] = '[';
    if (99 < (uint)index) {
      lStack_30 = 3;
      this->buffer[2] = '1';
      index._0_4_ = (uint)index % 100;
    }
    this->buffer[lStack_30] = (char)((ulong)(uint)index / 10) + '0';
    this->buffer[lStack_30 + 1] = (char)((ulong)(uint)index % 10) + '0';
    this->buffer[lStack_30 + 2] = 'm';
    this->buffer[lStack_30 + 3] = '\0';
  }
  else {
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      this->buffer[local_34] = esc[local_34];
    }
    this_local._4_4_ = text_color.value;
    rgb::rgb(&local_37,this_local._4_4_);
    to_esc(local_37.r,this->buffer + 7,';');
    to_esc(local_37.g,this->buffer + 0xb,';');
    to_esc(local_37.b,this->buffer + 0xf,'m');
    this->buffer[0x13] = '\0';
  }
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(detail::color_type text_color,
                                  const char* esc) FMT_NOEXCEPT {
    // If we have a terminal color, we need to output another escape code
    // sequence.
    if (!text_color.is_rgb) {
      bool is_background = esc == detail::data::background_color;
      uint32_t value = text_color.value.term_color;
      // Background ASCII codes are the same as the foreground ones but with
      // 10 more.
      if (is_background) value += 10u;

      size_t index = 0;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');

      if (value >= 100u) {
        buffer[index++] = static_cast<Char>('1');
        value %= 100u;
      }
      buffer[index++] = static_cast<Char>('0' + value / 10u);
      buffer[index++] = static_cast<Char>('0' + value % 10u);

      buffer[index++] = static_cast<Char>('m');
      buffer[index++] = static_cast<Char>('\0');
      return;
    }

    for (int i = 0; i < 7; i++) {
      buffer[i] = static_cast<Char>(esc[i]);
    }
    rgb color(text_color.value.rgb_color);
    to_esc(color.r, buffer + 7, ';');
    to_esc(color.g, buffer + 11, ';');
    to_esc(color.b, buffer + 15, 'm');
    buffer[19] = static_cast<Char>(0);
  }